

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O0

char * __cxxabiv1::anon_unknown_0::parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *in_RDX;
  long in_RSI;
  char *in_RDI;
  char *t_2;
  char *t_1;
  char *t;
  bool try_to_parse_template_args;
  value_type *in_stack_fffffffffffff0e8;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *in_stack_fffffffffffff0f0;
  char (*in_stack_fffffffffffff0f8) [18];
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *in_stack_fffffffffffff100;
  size_type in_stack_fffffffffffff108;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  *in_stack_fffffffffffff110;
  Db *in_stack_fffffffffffff218;
  char *in_stack_fffffffffffff220;
  char *in_stack_fffffffffffff228;
  char local_bc8 [1168];
  Db *in_stack_fffffffffffff8c8;
  char *in_stack_fffffffffffff8d0;
  char *in_stack_fffffffffffff8d8;
  char *local_10;
  
  local_10 = in_RDI;
  if (1 < in_RSI - (long)in_RDI) {
    switch(*in_RDI) {
    case 'a':
      switch(in_RDI[1]) {
      case 'N':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'S':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'a':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'd':
      case 'n':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'c':
      local_10 = in_RDI;
      switch(in_RDI[1]) {
      case 'l':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'm':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'o':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'v':
        bVar1 = *(byte *)((long)&in_RDX[1].second._M_string_length + 7);
        *(undefined1 *)((long)&in_RDX[1].second._M_string_length + 7) = 0;
        pcVar5 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>
                           (in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                            in_stack_fffffffffffff8c8);
        *(byte *)((long)&in_RDX[1].second._M_string_length + 7) = bVar1 & 1;
        local_10 = in_RDI;
        if (pcVar5 != in_RDI + 2) {
          bVar3 = std::
                  vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                  ::empty((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                           *)in_stack_fffffffffffff100);
          if (bVar3) {
            return in_RDI;
          }
          std::
          vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ::back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                  *)in_stack_fffffffffffff0f0);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::insert(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                   (char *)in_stack_fffffffffffff100);
          *(undefined1 *)((long)&in_RDX[1].second._M_string_length + 4) = 1;
          local_10 = pcVar5;
        }
      }
      break;
    case 'd':
      switch(in_RDI[1]) {
      case 'V':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'a':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<18ul>(in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'e':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'l':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<16ul>(in_stack_fffffffffffff100,(char (*) [16])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'v':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'e':
      cVar2 = in_RDI[1];
      if (cVar2 == 'O') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      else if (cVar2 == 'o') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      else if (cVar2 == 'q') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'g':
      if (in_RDI[1] == 'e') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      else if (in_RDI[1] == 't') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'i':
      if (in_RDI[1] == 'x') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'l':
      local_10 = in_RDI;
      switch(in_RDI[1]) {
      case 'S':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<12ul>(in_stack_fffffffffffff100,(char (*) [12])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'e':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'i':
        pcVar5 = parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>
                           (in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                            in_stack_fffffffffffff218);
        local_10 = in_RDI;
        if (pcVar5 != in_RDI + 2) {
          bVar3 = std::
                  vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                  ::empty((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                           *)in_stack_fffffffffffff100);
          if (bVar3) {
            return in_RDI;
          }
          std::
          vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ::back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                  *)in_stack_fffffffffffff0f0);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::insert(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                   (char *)in_stack_fffffffffffff100);
          local_10 = pcVar5;
        }
        break;
      case 's':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 't':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'm':
      switch(in_RDI[1]) {
      case 'I':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'L':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'i':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'l':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'm':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'n':
      switch(in_RDI[1]) {
      case 'a':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<15ul>(in_stack_fffffffffffff100,(char (*) [15])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'e':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'g':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 't':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'w':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<13ul>(in_stack_fffffffffffff100,(char (*) [13])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'o':
      cVar2 = in_RDI[1];
      if (cVar2 == 'R') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      else if (cVar2 == 'o') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      else if (cVar2 == 'r') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'p':
      switch(in_RDI[1]) {
      case 'L':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'l':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'm':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<12ul>(in_stack_fffffffffffff100,(char (*) [12])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'p':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 's':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 't':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'q':
      if (in_RDI[1] == 'u') {
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'r':
      switch(in_RDI[1]) {
      case 'M':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_stack_fffffffffffff100,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 'S':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<12ul>(in_stack_fffffffffffff100,(char (*) [12])local_bc8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_RDX,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_RDX);
        local_10 = in_RDI + 2;
        break;
      case 'm':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<10ul>(in_stack_fffffffffffff100,(char (*) [10])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
        break;
      case 's':
        (anonymous_namespace)::
        string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
        ::string_pair<11ul>(in_RDX,(char (*) [11])in_stack_fffffffffffff0f8);
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                     *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(in_stack_fffffffffffff0f0);
        local_10 = in_RDI + 2;
      }
      break;
    case 'v':
      iVar4 = isdigit((int)in_RDI[1]);
      local_10 = in_RDI;
      if ((iVar4 != 0) &&
         (pcVar5 = parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>
                             (in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                              in_stack_fffffffffffff218), local_10 = in_RDI, pcVar5 != in_RDI + 2))
      {
        bVar3 = std::
                vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                ::empty((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                         *)in_stack_fffffffffffff100);
        if (bVar3) {
          return in_RDI;
        }
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::back((vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                *)in_stack_fffffffffffff0f0);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::insert(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (char *)in_stack_fffffffffffff100);
        local_10 = pcVar5;
      }
    }
  }
  return local_10;
}

Assistant:

const char*
parse_operator_name(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        switch (first[0])
        {
        case 'a':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator&&");
                first += 2;
                break;
            case 'd':
            case 'n':
                db.names.push_back("operator&");
                first += 2;
                break;
            case 'N':
                db.names.push_back("operator&=");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator=");
                first += 2;
                break;
            }
            break;
        case 'c':
            switch (first[1])
            {
            case 'l':
                db.names.push_back("operator()");
                first += 2;
                break;
            case 'm':
                db.names.push_back("operator,");
                first += 2;
                break;
            case 'o':
                db.names.push_back("operator~");
                first += 2;
                break;
            case 'v':
                {
                    bool try_to_parse_template_args = db.try_to_parse_template_args;
                    db.try_to_parse_template_args = false;
                    const char* t = parse_type(first+2, last, db);
                    db.try_to_parse_template_args = try_to_parse_template_args;
                    if (t != first+2)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.insert(0, "operator ");
                        db.parsed_ctor_dtor_cv = true;
                        first = t;
                    }
                }
                break;
            }
            break;
        case 'd':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator delete[]");
                first += 2;
                break;
            case 'e':
                db.names.push_back("operator*");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator delete");
                first += 2;
                break;
            case 'v':
                db.names.push_back("operator/");
                first += 2;
                break;
            case 'V':
                db.names.push_back("operator/=");
                first += 2;
                break;
            }
            break;
        case 'e':
            switch (first[1])
            {
            case 'o':
                db.names.push_back("operator^");
                first += 2;
                break;
            case 'O':
                db.names.push_back("operator^=");
                first += 2;
                break;
            case 'q':
                db.names.push_back("operator==");
                first += 2;
                break;
            }
            break;
        case 'g':
            switch (first[1])
            {
            case 'e':
                db.names.push_back("operator>=");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator>");
                first += 2;
                break;
            }
            break;
        case 'i':
            if (first[1] == 'x')
            {
                db.names.push_back("operator[]");
                first += 2;
            }
            break;
        case 'l':
            switch (first[1])
            {
            case 'e':
                db.names.push_back("operator<=");
                first += 2;
                break;
            case 'i':
                {
                    const char* t = parse_source_name(first+2, last, db);
                    if (t != first+2)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.insert(0, "operator\"\" ");
                        first = t;
                    }
                }
                break;
            case 's':
                db.names.push_back("operator<<");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator<<=");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator<");
                first += 2;
                break;
            }
            break;
        case 'm':
            switch (first[1])
            {
            case 'i':
                db.names.push_back("operator-");
                first += 2;
                break;
            case 'I':
                db.names.push_back("operator-=");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator*");
                first += 2;
                break;
            case 'L':
                db.names.push_back("operator*=");
                first += 2;
                break;
            case 'm':
                db.names.push_back("operator--");
                first += 2;
                break;
            }
            break;
        case 'n':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator new[]");
                first += 2;
                break;
            case 'e':
                db.names.push_back("operator!=");
                first += 2;
                break;
            case 'g':
                db.names.push_back("operator-");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator!");
                first += 2;
                break;
            case 'w':
                db.names.push_back("operator new");
                first += 2;
                break;
            }
            break;
        case 'o':
            switch (first[1])
            {
            case 'o':
                db.names.push_back("operator||");
                first += 2;
                break;
            case 'r':
                db.names.push_back("operator|");
                first += 2;
                break;
            case 'R':
                db.names.push_back("operator|=");
                first += 2;
                break;
            }
            break;
        case 'p':
            switch (first[1])
            {
            case 'm':
                db.names.push_back("operator->*");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator+");
                first += 2;
                break;
            case 'L':
                db.names.push_back("operator+=");
                first += 2;
                break;
            case 'p':
                db.names.push_back("operator++");
                first += 2;
                break;
            case 's':
                db.names.push_back("operator+");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator->");
                first += 2;
                break;
            }
            break;
        case 'q':
            if (first[1] == 'u')
            {
                db.names.push_back("operator?");
                first += 2;
            }
            break;
        case 'r':
            switch (first[1])
            {
            case 'm':
                db.names.push_back("operator%");
                first += 2;
                break;
            case 'M':
                db.names.push_back("operator%=");
                first += 2;
                break;
            case 's':
                db.names.push_back("operator>>");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator>>=");
                first += 2;
                break;
            }
            break;
        case 'v':
            if (std::isdigit(first[1]))
            {
                const char* t = parse_source_name(first+2, last, db);
                if (t != first+2)
                {
                    if (db.names.empty())
                        return first;
                    db.names.back().first.insert(0, "operator ");
                    first = t;
                }
            }
            break;
        }
    }
    return first;
}